

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

void MapOptHandler_redirect(FMapInfoParser *parse,level_info_t *info)

{
  level_info_t *info_local;
  FMapInfoParser *parse_local;
  
  FMapInfoParser::ParseAssign(parse);
  FScanner::MustGetString(&parse->sc);
  FName::operator=(&info->RedirectType,(parse->sc).String);
  FMapInfoParser::ParseComma(parse);
  FMapInfoParser::ParseNextMap(parse,&info->RedirectMapName);
  return;
}

Assistant:

DEFINE_MAP_OPTION(redirect, true)
{
	parse.ParseAssign();
	parse.sc.MustGetString();
	info->RedirectType = parse.sc.String;
	parse.ParseComma();
	parse.ParseNextMap(info->RedirectMapName);
}